

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTypeInfoImpl.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DOMTypeInfoImpl::getStringProperty(DOMTypeInfoImpl *this,PSVIProperty prop)

{
  uint uVar1;
  
  uVar1 = prop - PSVI_Type_Definition_Name;
  if ((uVar1 < 9) && ((0x1b3U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(XMLCh **)
            ((long)&(this->super_DOMTypeInfo)._vptr_DOMTypeInfo +
            *(long *)(&DAT_00348f20 + (ulong)uVar1 * 8));
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMTypeInfoImpl.cpp"
                ,0x87,
                "virtual const XMLCh *xercesc_4_0::DOMTypeInfoImpl::getStringProperty(PSVIProperty) const"
               );
}

Assistant:

const XMLCh* DOMTypeInfoImpl::getStringProperty(PSVIProperty prop) const {
    switch(prop)
    {
    case PSVI_Type_Definition_Name:             return fTypeName;
    case PSVI_Type_Definition_Namespace:        return fTypeNamespace;
    case PSVI_Member_Type_Definition_Name:      return fMemberTypeName;
    case PSVI_Member_Type_Definition_Namespace: return fMemberTypeNamespace;
    case PSVI_Schema_Default:                   return fDefaultValue;
    case PSVI_Schema_Normalized_Value:          return fNormalizedValue;
    default:                                    assert(false); /* it's not a string property */
    }
    return 0;
}